

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgEnc.c
# Opt level: O1

void zvgEnc(int xStart,int yStart,int xEnd,int yEnd)

{
  bool bVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  byte bVar12;
  byte bVar13;
  uchar uVar14;
  uint yStart_00;
  uchar uVar15;
  uint xStart_00;
  byte bVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  int iVar21;
  byte bVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  
  ZvgENC.vecCount = ZvgENC.vecCount + 1;
  xStart_00 = -(ZvgENC.encFlags & 1) ^ xStart;
  uVar18 = -(ZvgENC.encFlags & 1) ^ xEnd;
  uVar19 = -(uint)((ZvgENC.encFlags >> 1 & 1) != 0);
  yStart_00 = uVar19 ^ yStart;
  uVar19 = uVar19 ^ yEnd;
  if (yStart != yEnd && xStart != xEnd) {
    lVar24 = (long)(int)xStart_00;
    lVar17 = (int)uVar18 - lVar24;
    lVar9 = ((lVar24 - ZvgENC.xMinClip) * 0x10000) / -lVar17;
    if (lVar17 < 1) {
      if (lVar9 < 0) goto LAB_00102b2f;
      lVar23 = 0x10000;
      if (lVar9 < 0x10000) {
        lVar23 = lVar9;
      }
      lVar20 = 0;
      lVar9 = 0;
    }
    else {
      lVar23 = 0x10000;
      if (lVar9 < 0x10001) {
        lVar20 = 0;
        if (lVar9 < 1) {
          lVar9 = lVar20;
        }
      }
      else {
LAB_00102b2f:
        lVar23 = 0x10000;
        lVar20 = 1;
        lVar9 = 0;
      }
    }
    bVar5 = true;
    if ((char)lVar20 == '\0') {
      lVar24 = ((ZvgENC.xMaxClip - lVar24) * 0x10000) / lVar17;
      bVar4 = true;
      if (lVar17 < 0) {
        if (lVar24 <= lVar23) {
          if (lVar9 < lVar24) {
            lVar9 = lVar24;
          }
          goto LAB_00102b6d;
        }
      }
      else if (lVar9 <= lVar24) {
        if (lVar24 < lVar23) {
          lVar23 = lVar24;
        }
LAB_00102b6d:
        bVar4 = false;
      }
      if (!bVar4) {
        lVar20 = (long)(int)yStart_00;
        lVar25 = (int)uVar19 - lVar20;
        lVar24 = ((lVar20 - ZvgENC.yMinClip) * 0x10000) / -lVar25;
        bVar4 = true;
        if (lVar25 < 1) {
          if (lVar9 <= lVar24) {
            if (lVar24 < lVar23) {
              lVar23 = lVar24;
            }
            goto LAB_00102bba;
          }
        }
        else if (lVar24 <= lVar23) {
          if (lVar9 < lVar24) {
            lVar9 = lVar24;
          }
LAB_00102bba:
          bVar4 = false;
        }
        if (!bVar4) {
          lVar24 = ((ZvgENC.yMaxClip - lVar20) * 0x10000) / lVar25;
          bVar4 = true;
          if (lVar25 < 0) {
            if (lVar24 <= lVar23) {
              if (lVar9 < lVar24) {
                lVar9 = lVar24;
              }
              goto LAB_00102bf5;
            }
          }
          else if (lVar9 <= lVar24) {
            if (lVar24 < lVar23) {
              lVar23 = lVar24;
            }
LAB_00102bf5:
            bVar4 = false;
          }
          if (!bVar4) {
            if (lVar23 < 0x10000) {
              uVar18 = (int)((ulong)(lVar23 * lVar17 + 0x8000) >> 0x10) + xStart_00;
              uVar19 = (int)((ulong)(lVar23 * lVar25 + 0x8000) >> 0x10) + yStart_00;
            }
            if (0 < lVar9) {
              xStart_00 = xStart_00 + (int)((ulong)(lVar17 * lVar9 + 0x8000) >> 0x10);
              yStart_00 = yStart_00 + (int)((ulong)(lVar25 * lVar9 + 0x8000) >> 0x10);
            }
            bVar5 = false;
          }
        }
      }
    }
    if (bVar5) {
      return;
    }
  }
  if ((uVar18 == xStart_00) && (uVar19 == yStart_00)) {
    if ((int)xStart_00 < ZvgENC.xMinClip) {
      return;
    }
    if (ZvgENC.xMaxClip < (int)xStart_00) {
      return;
    }
    if ((int)yStart_00 < ZvgENC.yMinClip) {
      return;
    }
    if (ZvgENC.yMaxClip < (int)yStart_00) {
      return;
    }
    goto LAB_00102c92;
  }
  bVar16 = (ZvgENC.encColor != ZvgENC.zColor) * '@';
  bVar5 = ZvgENC.yPos != yStart_00;
  bVar4 = ZvgENC.xPos != xStart_00;
  bVar12 = bVar16 | 0x90;
  if (!bVar5 && !bVar4) {
    bVar12 = bVar16 + 0x10;
  }
  uVar6 = uVar18 - xStart_00;
  bVar1 = (int)uVar18 < (int)xStart_00;
  uVar10 = -uVar6;
  if (0 < (int)uVar6) {
    uVar10 = uVar6;
  }
  uVar7 = uVar19 - yStart_00;
  uVar6 = -uVar7;
  if (0 < (int)uVar7) {
    uVar6 = uVar7;
  }
  bVar2 = (int)uVar19 < (int)yStart_00;
  uVar14 = (uchar)yStart_00;
  bVar16 = (byte)(yStart_00 >> 8);
  if (uVar19 == yStart_00) {
    if ((int)yStart_00 < ZvgENC.yMinClip) {
      return;
    }
    if (ZvgENC.yMaxClip < (int)yStart_00) {
      return;
    }
    if ((int)uVar18 < (int)xStart_00) {
      if (ZvgENC.xMaxClip < (int)uVar18) {
        return;
      }
      if ((int)xStart_00 < ZvgENC.xMinClip) {
        return;
      }
      iVar21 = ZvgENC.xMinClip - uVar18;
      uVar6 = ZvgENC.xMinClip;
      if (iVar21 < 1) {
        iVar21 = 0;
        uVar6 = uVar18;
      }
      uVar10 = uVar10 - iVar21;
      if (bVar5 || bVar4) {
        iVar21 = xStart_00 - ZvgENC.xMaxClip;
        if (0 < iVar21) {
          xStart_00 = ZvgENC.xMaxClip;
        }
        iVar8 = 0;
        if (0 < iVar21) {
          iVar8 = iVar21;
        }
        uVar10 = uVar10 - iVar8;
      }
    }
    else {
      if ((int)uVar18 < ZvgENC.xMinClip) {
        return;
      }
      if (ZvgENC.xMaxClip < (int)xStart_00) {
        return;
      }
      iVar21 = uVar18 - ZvgENC.xMaxClip;
      uVar6 = uVar18;
      if (0 < iVar21) {
        uVar6 = ZvgENC.xMaxClip;
      }
      if (iVar21 < 1) {
        iVar21 = 0;
      }
      uVar10 = uVar10 - iVar21;
      if (bVar5 || bVar4) {
        iVar21 = 0;
        if (0 < (int)(ZvgENC.xMinClip - xStart_00)) {
          iVar21 = ZvgENC.xMinClip - xStart_00;
          xStart_00 = ZvgENC.xMinClip;
        }
        uVar10 = uVar10 - iVar21;
      }
    }
    if (uVar10 == 0) goto LAB_00102c92;
    if ((ZvgENC.encFlags & 4) != 0) {
      if ((int)xStart_00 < ZvgENC.xMinSpot) {
        ZvgENC.xMinSpot = xStart_00;
      }
      if (ZvgENC.xMaxSpot < (int)xStart_00) {
        ZvgENC.xMaxSpot = xStart_00;
      }
      if ((int)uVar6 < ZvgENC.xMinSpot) {
        ZvgENC.xMinSpot = uVar6;
      }
      if (ZvgENC.xMaxSpot < (int)uVar6) {
        ZvgENC.xMaxSpot = uVar6;
      }
      if ((int)yStart_00 < ZvgENC.yMinSpot) {
        ZvgENC.yMinSpot = yStart_00;
      }
      if (ZvgENC.yMaxSpot < (int)yStart_00) {
        ZvgENC.yMaxSpot = yStart_00;
      }
    }
    bVar22 = bVar12 | 0x20;
    if (0xff < uVar10) {
      bVar22 = bVar12;
    }
    uVar11 = (ulong)ZvgENC.encCount;
    ZvgENC.encCount = ZvgENC.encCount + 1;
    ZvgENC.encBfr[uVar11] = bVar1 | bVar22 | 4;
    if ((bVar22 & 0x40) != 0) {
      uVar11 = (ulong)ZvgENC.encCount;
      ZvgENC.encCount = ZvgENC.encCount + 1;
      ZvgENC.encBfr[uVar11] = ZvgENC.encColor._1_1_;
      uVar11 = (ulong)ZvgENC.encCount;
      ZvgENC.encCount = ZvgENC.encCount + 1;
      ZvgENC.encBfr[uVar11] = (uchar)ZvgENC.encColor;
    }
    uVar18 = uVar6;
    if (0x7f < bVar22) {
      uVar11 = (ulong)ZvgENC.encCount;
      ZvgENC.encCount = ZvgENC.encCount + 1;
      ZvgENC.encBfr[uVar11] = (uchar)xStart_00;
      uVar11 = (ulong)ZvgENC.encCount;
      ZvgENC.encCount = ZvgENC.encCount + 1;
      ZvgENC.encBfr[uVar11] = bVar16 & 0xf | (byte)(xStart_00 >> 4) & 0xf0;
      uVar11 = (ulong)ZvgENC.encCount;
      ZvgENC.encCount = ZvgENC.encCount + 1;
      ZvgENC.encBfr[uVar11] = uVar14;
    }
joined_r0x00102ef2:
    if ((bVar22 & 0x20) != 0) goto LAB_001032ad;
    bVar12 = (byte)(uVar10 >> 8) & 0xf;
    uVar6 = uVar10;
  }
  else {
    uVar15 = (uchar)xStart_00;
    if (uVar18 == xStart_00) {
      if ((int)xStart_00 < ZvgENC.xMinClip) {
        return;
      }
      if (ZvgENC.xMaxClip < (int)xStart_00) {
        return;
      }
      if ((int)uVar19 < (int)yStart_00) {
        if (ZvgENC.yMaxClip < (int)uVar19) {
          return;
        }
        if ((int)yStart_00 < ZvgENC.yMinClip) {
          return;
        }
        iVar21 = ZvgENC.yMinClip - uVar19;
        uVar10 = ZvgENC.yMinClip;
        if (iVar21 < 1) {
          iVar21 = 0;
          uVar10 = uVar19;
        }
        uVar19 = uVar10;
        uVar10 = uVar6 - iVar21;
        if (bVar5 || bVar4) {
          iVar21 = yStart_00 - ZvgENC.yMaxClip;
          uVar6 = ZvgENC.yMaxClip;
LAB_0010330e:
          iVar8 = 0;
          if (0 < iVar21) {
            iVar8 = iVar21;
            yStart_00 = uVar6;
          }
          uVar10 = uVar10 - iVar8;
        }
      }
      else {
        if ((int)uVar19 < ZvgENC.yMinClip) {
          return;
        }
        if (ZvgENC.yMaxClip < (int)yStart_00) {
          return;
        }
        iVar21 = uVar19 - ZvgENC.yMaxClip;
        uVar10 = ZvgENC.yMaxClip;
        if (iVar21 < 1) {
          iVar21 = 0;
          uVar10 = uVar19;
        }
        uVar19 = uVar10;
        uVar10 = uVar6 - iVar21;
        if (bVar5 || bVar4) {
          iVar21 = ZvgENC.yMinClip - yStart_00;
          uVar6 = ZvgENC.yMinClip;
          goto LAB_0010330e;
        }
      }
      if (uVar10 == 0) {
LAB_00102c92:
        zvgEncPointSK(xStart_00,yStart_00,ZvgENC.encColor);
        return;
      }
      if ((ZvgENC.encFlags & 4) != 0) {
        if ((int)xStart_00 < ZvgENC.xMinSpot) {
          ZvgENC.xMinSpot = xStart_00;
        }
        if (ZvgENC.xMaxSpot < (int)xStart_00) {
          ZvgENC.xMaxSpot = xStart_00;
        }
        if ((int)yStart_00 < ZvgENC.yMinSpot) {
          ZvgENC.yMinSpot = yStart_00;
        }
        if (ZvgENC.yMaxSpot < (int)yStart_00) {
          ZvgENC.yMaxSpot = yStart_00;
        }
        if ((int)uVar19 < ZvgENC.yMinSpot) {
          ZvgENC.yMinSpot = uVar19;
        }
        if (ZvgENC.yMaxSpot < (int)uVar19) {
          ZvgENC.yMaxSpot = uVar19;
        }
      }
      bVar22 = bVar12 | 0x20;
      if (0xff < uVar10) {
        bVar22 = bVar12;
      }
      uVar11 = (ulong)ZvgENC.encCount;
      ZvgENC.encCount = ZvgENC.encCount + 1;
      ZvgENC.encBfr[uVar11] = bVar2 | bVar22 | 6;
LAB_00102e65:
      if ((bVar22 & 0x40) != 0) {
        uVar11 = (ulong)ZvgENC.encCount;
        ZvgENC.encCount = ZvgENC.encCount + 1;
        ZvgENC.encBfr[uVar11] = ZvgENC.encColor._1_1_;
        uVar11 = (ulong)ZvgENC.encCount;
        ZvgENC.encCount = ZvgENC.encCount + 1;
        ZvgENC.encBfr[uVar11] = (uchar)ZvgENC.encColor;
      }
      if (0x7f < bVar22) {
        uVar11 = (ulong)ZvgENC.encCount;
        ZvgENC.encCount = ZvgENC.encCount + 1;
        ZvgENC.encBfr[uVar11] = uVar15;
        uVar11 = (ulong)ZvgENC.encCount;
        ZvgENC.encCount = ZvgENC.encCount + 1;
        ZvgENC.encBfr[uVar11] = (byte)(yStart_00 >> 8) & 0xf | (byte)(xStart_00 >> 4) & 0xf0;
        uVar11 = (ulong)ZvgENC.encCount;
        ZvgENC.encCount = ZvgENC.encCount + 1;
        ZvgENC.encBfr[uVar11] = (uchar)yStart_00;
      }
      goto joined_r0x00102ef2;
    }
    if (uVar6 == uVar10) {
      if ((ZvgENC.encFlags & 4) != 0) {
        if ((int)xStart_00 < ZvgENC.xMinSpot) {
          ZvgENC.xMinSpot = xStart_00;
        }
        if (ZvgENC.xMaxSpot < (int)xStart_00) {
          ZvgENC.xMaxSpot = xStart_00;
        }
        if ((int)uVar18 < ZvgENC.xMinSpot) {
          ZvgENC.xMinSpot = uVar18;
        }
        if (ZvgENC.xMaxSpot < (int)uVar18) {
          ZvgENC.xMaxSpot = uVar18;
        }
        if ((int)yStart_00 < ZvgENC.yMinSpot) {
          ZvgENC.yMinSpot = yStart_00;
        }
        if (ZvgENC.yMaxSpot < (int)yStart_00) {
          ZvgENC.yMaxSpot = yStart_00;
        }
        if ((int)uVar19 < ZvgENC.yMinSpot) {
          ZvgENC.yMinSpot = uVar19;
        }
        if (ZvgENC.yMaxSpot < (int)uVar19) {
          ZvgENC.yMaxSpot = uVar19;
        }
      }
      bVar22 = bVar12 | 0x20;
      if (0xff < uVar10) {
        bVar22 = bVar12;
      }
      uVar11 = (ulong)ZvgENC.encCount;
      ZvgENC.encCount = ZvgENC.encCount + 1;
      ZvgENC.encBfr[uVar11] = bVar2 + ((int)uVar18 < (int)xStart_00) * '\x02' | bVar22;
      goto LAB_00102e65;
    }
    if ((ZvgENC.encFlags & 4) != 0) {
      if ((int)xStart_00 < ZvgENC.xMinSpot) {
        ZvgENC.xMinSpot = xStart_00;
      }
      if (ZvgENC.xMaxSpot < (int)xStart_00) {
        ZvgENC.xMaxSpot = xStart_00;
      }
      if ((int)uVar18 < ZvgENC.xMinSpot) {
        ZvgENC.xMinSpot = uVar18;
      }
      if (ZvgENC.xMaxSpot < (int)uVar18) {
        ZvgENC.xMaxSpot = uVar18;
      }
      if ((int)yStart_00 < ZvgENC.yMinSpot) {
        ZvgENC.yMinSpot = yStart_00;
      }
      if (ZvgENC.yMaxSpot < (int)yStart_00) {
        ZvgENC.yMaxSpot = yStart_00;
      }
      if ((int)uVar19 < ZvgENC.yMinSpot) {
        ZvgENC.yMinSpot = uVar19;
      }
      if (ZvgENC.yMaxSpot < (int)uVar19) {
        ZvgENC.yMaxSpot = uVar19;
      }
    }
    bVar22 = bVar2 + ((int)uVar18 < (int)xStart_00) * '\x02';
    if (uVar6 < uVar10) {
      auVar3 = (ZEXT416(uVar6) << 0x10) / ZEXT416(uVar10);
      bVar13 = bVar12 | 8;
      if (uVar10 < 0x80) {
        bVar13 = bVar12 | 0x28;
      }
      uVar11 = (ulong)ZvgENC.encCount;
      ZvgENC.encCount = ZvgENC.encCount + 1;
      ZvgENC.encBfr[uVar11] = bVar22 | bVar13;
      if ((bVar13 & 0x40) != 0) {
        uVar11 = (ulong)ZvgENC.encCount;
        ZvgENC.encCount = ZvgENC.encCount + 1;
        ZvgENC.encBfr[uVar11] = ZvgENC.encColor._1_1_;
        uVar11 = (ulong)ZvgENC.encCount;
        ZvgENC.encCount = ZvgENC.encCount + 1;
        ZvgENC.encBfr[uVar11] = (uchar)ZvgENC.encColor;
      }
      if (0x7f < bVar13) {
        uVar11 = (ulong)ZvgENC.encCount;
        ZvgENC.encCount = ZvgENC.encCount + 1;
        ZvgENC.encBfr[uVar11] = uVar15;
        uVar11 = (ulong)ZvgENC.encCount;
        ZvgENC.encCount = ZvgENC.encCount + 1;
        ZvgENC.encBfr[uVar11] = bVar16 & 0xf | (byte)(xStart_00 >> 4) & 0xf0;
        uVar11 = (ulong)ZvgENC.encCount;
        ZvgENC.encCount = ZvgENC.encCount + 1;
        ZvgENC.encBfr[uVar11] = uVar14;
      }
      uVar11 = (ulong)ZvgENC.encCount;
      ZvgENC.encCount = ZvgENC.encCount + 1;
      ZvgENC.encBfr[uVar11] = auVar3[1];
      if ((bVar13 & 0x20) != 0) goto LAB_001032ad;
      bVar12 = (byte)(uVar10 >> 8) & 0xf | auVar3[0] & 0xf0;
      uVar6 = uVar10;
    }
    else {
      auVar3 = (ZEXT416(uVar10) << 0x10) / ZEXT416(uVar6);
      bVar13 = bVar12 | 8;
      if (uVar6 < 0x80) {
        bVar13 = bVar12 | 0x28;
      }
      uVar11 = (ulong)ZvgENC.encCount;
      ZvgENC.encCount = ZvgENC.encCount + 1;
      ZvgENC.encBfr[uVar11] = bVar22 | bVar13 | 4;
      if ((bVar13 & 0x40) != 0) {
        uVar11 = (ulong)ZvgENC.encCount;
        ZvgENC.encCount = ZvgENC.encCount + 1;
        ZvgENC.encBfr[uVar11] = ZvgENC.encColor._1_1_;
        uVar11 = (ulong)ZvgENC.encCount;
        ZvgENC.encCount = ZvgENC.encCount + 1;
        ZvgENC.encBfr[uVar11] = (uchar)ZvgENC.encColor;
      }
      if (0x7f < bVar13) {
        uVar11 = (ulong)ZvgENC.encCount;
        ZvgENC.encCount = ZvgENC.encCount + 1;
        ZvgENC.encBfr[uVar11] = uVar15;
        uVar11 = (ulong)ZvgENC.encCount;
        ZvgENC.encCount = ZvgENC.encCount + 1;
        ZvgENC.encBfr[uVar11] = bVar16 & 0xf | (byte)(xStart_00 >> 4) & 0xf0;
        uVar11 = (ulong)ZvgENC.encCount;
        ZvgENC.encCount = ZvgENC.encCount + 1;
        ZvgENC.encBfr[uVar11] = uVar14;
      }
      uVar11 = (ulong)ZvgENC.encCount;
      ZvgENC.encCount = ZvgENC.encCount + 1;
      ZvgENC.encBfr[uVar11] = auVar3[1];
      uVar10 = uVar6;
      if ((bVar13 & 0x20) != 0) goto LAB_001032ad;
      bVar12 = (byte)(uVar6 >> 8) & 0xf | auVar3[0] & 0xf0;
    }
  }
  uVar11 = (ulong)ZvgENC.encCount;
  ZvgENC.encCount = ZvgENC.encCount + 1;
  ZvgENC.encBfr[uVar11] = bVar12;
  uVar10 = uVar6;
LAB_001032ad:
  uVar11 = (ulong)ZvgENC.encCount;
  ZvgENC.encCount = ZvgENC.encCount + 1;
  ZvgENC.encBfr[uVar11] = (uchar)uVar10;
  ZvgENC.zColor = ZvgENC.encColor;
  ZvgENC.yPos = uVar19;
  ZvgENC.xPos = uVar18;
  return;
}

Assistant:

void zvgEnc( int xStart, int yStart, int xEnd, int yEnd)
{
	uint	xLen, yLen;
	uint	xSign, ySign, vRatio;
	uint	zvgCmd;
	int	diff;

	ZvgENC.vecCount++;						// count number of vectors

	// check for axis flips

	if (ZvgENC.encFlags & ENCF_FLIPX)
	{	xStart = ~xStart;
		xEnd = ~xEnd;
	}

	if (ZvgENC.encFlags & ENCF_FLIPY)
	{	yStart = ~yStart;
		yEnd = ~yEnd;
	}

	// Check if NOT a point, vertical or horizontal line, then
	// clip the line the old fashion way.

	if (xStart != xEnd && yStart != yEnd)
		if (!clipLine( &xStart, &yStart, &xEnd, &yEnd))
			return;								// if vector rejected, just return

	// Check for point

	if (xStart == xEnd && yStart == yEnd)
	{
		// clip data point

		if (xStart < ZvgENC.xMinClip)
			return;								// do nothing if outside window

		if (xStart > ZvgENC.xMaxClip)
			return;								// do nothing if outside window

		if (yStart < ZvgENC.yMinClip)
			return;								// do nothing if outside window

		if (yStart > ZvgENC.yMaxClip)
			return;								// do nothing if outside window

		// encode data point
		zvgEncPointSK( xStart, yStart, ZvgENC.encColor);
		return;
	}

	// Handle vectors.

	zvgCmd = zbVECTOR;						// indicate a vector is being drawn

	// Check to see if color has changed

	if (ZvgENC.encColor != ZvgENC.zColor)
		zvgCmd |= zbCOLOR;					// indicate color information is to be sent

	// Check to see if start of this vector is same as current trace position
	// (if start point is the same a previous, then it does not need to be clipped)

	if (xStart != ZvgENC.xPos || yStart != ZvgENC.yPos)
		zvgCmd |= zbABS;						// if not, the starting points must be sent

	// get direction of X and Y axis, and their respective lengths

	if (xEnd < xStart)
	{	xSign = 1;								// moves from right to left
		xLen = xStart - xEnd;				// get length of X axis
	}
	else
	{	xSign = 0;								// moves from left to right
		xLen = xEnd - xStart;				// get length of X axis
	}

	if (yEnd < yStart)
	{	ySign = 1;								// moves downward
		yLen = yStart - yEnd;				// get length of Y axis
	}
	else
	{	ySign = 0;	 							// moves upward
		yLen = yEnd - yStart;				// get length of Y axis
	}

	// check for horizontal line

	if (yLen == 0)
	{
		// clip vector if needed

		if (yStart < ZvgENC.yMinClip || yStart > ZvgENC.yMaxClip)
			return; 						// reject vector

		// Does vector move from right to left?

		if (xSign)
		{
			if (xEnd > ZvgENC.xMaxClip || xStart < ZvgENC.xMinClip)
				return;					// reject vector

			diff = ZvgENC.xMinClip - xEnd;

			if (diff > 0)
			{	xEnd += diff;			// clip line
				xLen -= diff;
			}

			// if new starting points sent, they must be clipped

			if (zvgCmd & zbABS)
			{
				diff = xStart - ZvgENC.xMaxClip;

				if (diff > 0)
				{	xStart -= diff;	// clip line
					xLen -= diff;
				}
			}
		}

		// Else, vector moves from left to right

		else
		{
			if (xEnd < ZvgENC.xMinClip || xStart > ZvgENC.xMaxClip)
				return;					// reject vector

			diff = xEnd - ZvgENC.xMaxClip;

			if (diff > 0)
			{	xEnd -= diff;			// clip line
				xLen -= diff;
			}

			// if new starting points sent, they must be clipped

			if (zvgCmd & zbABS)
			{
				diff = ZvgENC.xMinClip - xStart;

				if (diff > 0)
				{	xStart += diff;	// clip line
					xLen -= diff;
				}
			}
		}

		// check if vector clipped to a point, if so, encode point

		if (xLen == 0)
		{	zvgEncPointSK( xStart, yStart, ZvgENC.encColor);
			return;						// done sending point, return
		}

		if (ZvgENC.encFlags & ENCF_SPOTKILL)
		{
			CHECK_X_SPOT( xStart)
			CHECK_X_SPOT( xEnd)
			CHECK_Y_SPOT( yStart)
		}

		// if length fits in 8 bits, use short version of command

		if (xLen < 256)
			zvgCmd |= zbSHORT;			// use short length

		// send command

		ZvgENC.encBfr[ZvgENC.encCount++] = zvgCmd | zbHZVT | xSign;

		// send color if needed

		if (zvgCmd & zbCOLOR)
			sendColor( ZvgENC.encColor);

		// send starting positions if needed

		if (zvgCmd & zbABS)
			sendXY( xStart, yStart);

		// send length, short or long

		if (zvgCmd & zbSHORT)
			sendLen8( xLen);
	
		else
			sendLen12( xLen);
	}

	// check for vertical line

	else if (xLen == 0)
	{
		// clip vector if needed

		if (xStart < ZvgENC.xMinClip || xStart > ZvgENC.xMaxClip)
			return; 						// reject vector

		// Does vector move downward?

		if (ySign)
		{
			if (yEnd > ZvgENC.yMaxClip || yStart < ZvgENC.yMinClip)
				return;					// reject vector

			diff = ZvgENC.yMinClip - yEnd;

			if (diff > 0)
			{	yEnd += diff;			// clip line
				yLen -= diff;
			}

			// if new starting points sent, they must be clipped

			if (zvgCmd & zbABS)
			{
				diff = yStart - ZvgENC.yMaxClip;

				if (diff > 0)
				{	yStart -= diff;	// clip line
					yLen -= diff;
				}
			}
		}

		// Else, vector moves upward

		else
		{
			if (yEnd < ZvgENC.yMinClip || yStart > ZvgENC.yMaxClip)
				return;					// reject vector

			diff = yEnd - ZvgENC.yMaxClip;

			if (diff > 0)
			{	yEnd -= diff;			// clip line
				yLen -= diff;
			}

			// if new starting points sent, they must be clipped

			if (zvgCmd & zbABS)
			{
				diff = ZvgENC.yMinClip - yStart;

				if (diff > 0)
				{	yStart += diff;	// clip line
					yLen -= diff;
				}
			}
		}

		// check if vector clipped to a point, if so, encode point

		if (yLen == 0)
		{	zvgEncPointSK( xStart, yStart, ZvgENC.encColor);
			return;						// done sending point, return
		}

		if (ZvgENC.encFlags & ENCF_SPOTKILL)
		{
			CHECK_X_SPOT( xStart)
			CHECK_Y_SPOT( yStart)
			CHECK_Y_SPOT( yEnd)
		}

		// if length fits in 8 bits, use short version of command

		if (yLen < 256)
			zvgCmd |= zbSHORT;			// use short length

		// send command

		ZvgENC.encBfr[ZvgENC.encCount++] = zvgCmd | zbHZVT | zbVERT | ySign;

		// send color if needed

		if (zvgCmd & zbCOLOR)		
			sendColor( ZvgENC.encColor);

		// send starting positions if needed

		if (zvgCmd & zbABS)
			sendXY( xStart, yStart);

		// send length, short or long

		if (zvgCmd & zbSHORT)
			sendLen8( yLen);
	
		else
			sendLen12( yLen);
	}

	// look for 45 degree angle

	else if (yLen == xLen)
	{
		// spot kill test

		if (ZvgENC.encFlags & ENCF_SPOTKILL)
		{
			CHECK_X_SPOT( xStart)
			CHECK_X_SPOT( xEnd)
			CHECK_Y_SPOT( yStart)
			CHECK_Y_SPOT( yEnd)
		}

		// if length fits in 8 bits, send short length

		if (xLen < 256)
			zvgCmd |= zbSHORT;				// use short length

		// send ZVG command, and direction

		ZvgENC.encBfr[ZvgENC.encCount++] = zvgCmd | (xSign << 1) | ySign;

		if (zvgCmd & zbCOLOR)
			sendColor( ZvgENC.encColor);

		// if starting points required, send them

		if (zvgCmd & zbABS)
			sendXY( xStart, yStart);

		// if short length, send it

		if (zvgCmd & zbSHORT)
			sendLen8( xLen);
	
		// else, send long length

		else
			sendLen12( xLen);
	}

	// If not 45 degree angle, vertical, or horizontal, then ratio must be
	// calculated.

	else
	{
		// spot kill test

		if (ZvgENC.encFlags & ENCF_SPOTKILL)
		{
			CHECK_X_SPOT( xStart)
			CHECK_X_SPOT( xEnd)
			CHECK_Y_SPOT( yStart)
			CHECK_Y_SPOT( yEnd)
		}

		zvgCmd |= zbRATIO;					// indicate ratio being sent

		if (xLen > yLen)
		{
			// calculate integer ratio

			vRatio = (uint)(((ulong)yLen << 16) / xLen);

			// if length can fit in 7 bits, send short version of command

			if (xLen < 128)
				zvgCmd |= zbSHORT;			// use short length

			// send command

			ZvgENC.encBfr[ZvgENC.encCount++] = zvgCmd | (xSign << 1) | ySign;

			// send color if needed
		
			if (zvgCmd & zbCOLOR)
				sendColor( ZvgENC.encColor);

			// send start positions if needed

			if (zvgCmd & zbABS)
				sendXY( xStart, yStart);

			// send length and ratio, short or long

			if (zvgCmd & zbSHORT)
				sendRatioLen8( vRatio, xLen);
	
			else
				sendRatioLen12( vRatio, xLen);
		}

		// Else, Y length is greater than X length.

		else
		{
			// calculate ratio

			vRatio = (unsigned int)(((long)xLen << 16) / yLen);

			// if length can fit in 7 bits, send short version of command

			if (yLen < 128)
				zvgCmd |= zbSHORT;			// use short length

			// send command

			ZvgENC.encBfr[ZvgENC.encCount++] = zvgCmd | zbYLEN | (xSign << 1) | ySign;

			// send color if needed
		
			if (zvgCmd & zbCOLOR)
				sendColor( ZvgENC.encColor);

			// send start positions if needed

			if (zvgCmd & zbABS)
				sendXY( xStart, yStart);

			// send length and ratio, short or long

			if (zvgCmd & zbSHORT)
				sendRatioLen8( vRatio, yLen);
	
			else
				sendRatioLen12( vRatio, yLen);
		}
	}
	ZvgENC.xPos = xEnd;						// new position is end of vector
	ZvgENC.yPos = yEnd;
	ZvgENC.zColor = ZvgENC.encColor;		// save new color
}